

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpStructMatrix.cpp
# Opt level: O2

int __thiscall
TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::ClassId
          (TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZSpStructMatrix",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZStructMatrixT<double>::ClassId(&this->super_TPZStructMatrixT<double>);
  iVar3 = TPZStructMatrixOR<double>::ClassId
                    ((TPZStructMatrixOR<double> *)
                     &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.field_0xa0);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZSpStructMatrix<TVar,TPar>::ClassId() const{
    return Hash("TPZSpStructMatrix") ^
        TPZStructMatrixT<TVar>::ClassId() << 1 ^
        TPar::ClassId() << 2;
}